

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

uint32_t __thiscall cfd::core::Psbt::AddTxIn(Psbt *this,TxInReference *txin)

{
  uint32_t uVar1;
  uint32_t sequence;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  Txid local_38;
  AbstractTxInReference *local_18;
  TxInReference *txin_local;
  Psbt *this_local;
  
  local_18 = &txin->super_AbstractTxInReference;
  txin_local = (TxInReference *)this;
  AbstractTxInReference::GetTxid
            ((AbstractTxInReference *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
  ;
  uVar1 = AbstractTxInReference::GetVout(local_18);
  sequence = AbstractTxInReference::GetSequence(local_18);
  uVar1 = AddTxIn(this,&local_38,uVar1,sequence);
  Txid::~Txid((Txid *)0x499702);
  return uVar1;
}

Assistant:

uint32_t Psbt::AddTxIn(const TxInReference &txin) {
  return AddTxIn(txin.GetTxid(), txin.GetVout(), txin.GetSequence());
}